

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase725::run(TestCase725 *this)

{
  long lVar1;
  uint uVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  Own<kj::PromiseFulfiller<void>_> *params;
  char *pcVar6;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_06;
  void *extraout_RDX_01;
  void *pvVar7;
  void *extraout_RDX_02;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  int iVar8;
  char *in_R8;
  Reader RVar9;
  ArrayPtr<const_char> AVar10;
  bool local_ea2;
  bool local_ea1;
  undefined1 local_ea0 [6];
  bool _kj_shouldLog_10;
  bool _kj_shouldLog_9;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_e88;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_e50;
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_e18;
  uint32_t local_dd4 [2];
  bool local_dc9;
  undefined1 local_dc8 [7];
  bool _kj_shouldLog_8;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_db0;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_d78;
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_d40;
  Maybe<capnp::MessageSize> local_d00;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_ce8;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_cb0;
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_c78;
  uint32_t local_c34 [2];
  bool local_c29;
  undefined1 local_c28 [7];
  bool _kj_shouldLog_7;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_c10;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_bd8;
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_ba0;
  Maybe<capnp::MessageSize> local_b60;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_b48;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_b10;
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_ad8;
  uint32_t local_a94 [2];
  bool local_a89;
  undefined1 local_a88 [7];
  bool _kj_shouldLog_6;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_a70;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_a38;
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_a00;
  Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
  local_9c0;
  Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults> local_988;
  ArrayPtr<const_char> local_948;
  bool local_931;
  undefined1 local_930 [7];
  bool _kj_shouldLog_5;
  Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults> local_8f8;
  StringPtr local_8b8;
  Maybe<capnp::MessageSize> local_8a8;
  undefined1 local_890 [8];
  Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
  request_2;
  undefined1 local_850 [7];
  bool _kj_shouldLog_4;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> local_818;
  ArrayPtr<const_char> local_7d8;
  bool local_7c1;
  undefined1 local_7c0 [7];
  bool _kj_shouldLog_3;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> local_788;
  StringPtr local_748;
  Maybe<capnp::MessageSize> local_738;
  undefined1 local_720 [8];
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request_1;
  undefined1 local_6e0 [4];
  uint oldSentCount;
  Request<capnproto_test::capnp::test::TestMoreStuff::GetHeldParams,_capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>
  local_6c8;
  Request<capnproto_test::capnp::test::TestMoreStuff::GetHeldParams,_capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>
  local_690;
  Response<capnproto_test::capnp::test::TestMoreStuff::GetHeldResults> local_658;
  undefined1 local_618 [8];
  Client capCopy;
  Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
  local_5e8;
  Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
  local_5b0;
  Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults> local_578;
  ArrayPtr<const_char> local_538;
  bool local_521;
  undefined1 local_520 [7];
  bool _kj_shouldLog_2;
  Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
  local_508;
  Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
  local_4d0;
  Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults> local_498;
  StringPtr local_458;
  bool local_441;
  undefined1 local_440 [7];
  bool _kj_shouldLog_1;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_428;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_3f0;
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_3b8;
  uint32_t local_374 [2];
  bool local_369;
  undefined1 local_368 [7];
  bool _kj_shouldLog;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_350;
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  local_318;
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> local_2e0;
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  local_2a0;
  Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults> local_268;
  Own<capnp::_::TestCapDestructor> local_228;
  Client local_218;
  Maybe<capnp::MessageSize> local_200;
  undefined1 local_1e8 [8];
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  request;
  undefined1 local_1a0 [8];
  Client client;
  undefined1 *local_180;
  Promise<void> local_178;
  undefined1 local_168 [8];
  Promise<void> destructionPromise;
  bool destroyed;
  undefined1 local_148 [8];
  PromiseFulfillerPair<void> paf;
  TestContext context;
  TestCase725 *this_local;
  
  context.rpcServer.super_RpcSystemBase.impl.ptr = (Impl *)this;
  TestContext::TestContext((TestContext *)&paf.fulfiller.ptr);
  kj::newPromiseAndFulfiller<void>();
  destructionPromise.super_PromiseBase.node.ptr._3_1_ = 0;
  local_180 = (undefined1 *)((long)&destructionPromise.super_PromiseBase.node.ptr + 3);
  pcVar6 = &client.field_0x17;
  kj::Promise<void>::
  then<capnp::_::(anonymous_namespace)::TestCase725::run()::__0,kj::_::PropagateException>
            (&local_178,(Type *)local_148,(PropagateException *)&local_180);
  kj::Promise<void>::eagerlyEvaluate((Promise<void> *)local_168,&local_178);
  kj::Promise<void>::~Promise(&local_178);
  TestContext::connect
            ((TestContext *)&request.hook.ptr,(int)&paf + 0x18,(sockaddr *)0x5,(socklen_t)pcVar6);
  Capability::Client::castAs<capnproto_test::capnp::test::TestMoreStuff>
            ((Client *)local_1a0,(Client *)&request.hook.ptr);
  Capability::Client::~Client((Client *)&request.hook.ptr);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_200,(void *)0x0);
  capnproto_test::capnp::test::TestMoreStuff::Client::holdRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
              *)local_1e8,(Client *)local_1a0,&local_200);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_200);
  params = kj::mv<kj::Own<kj::PromiseFulfiller<void>>>
                     ((Own<kj::PromiseFulfiller<void>_> *)&paf.promise.super_PromiseBase.node.ptr);
  kj::heap<capnp::_::TestCapDestructor,kj::Own<kj::PromiseFulfiller<void>>>((kj *)&local_228,params)
  ;
  capnproto_test::capnp::test::TestInterface::Client::Client<capnp::_::TestCapDestructor,void>
            (&local_218,&local_228);
  capnproto_test::capnp::test::TestMoreStuff::HoldParams::Builder::setCap
            ((Builder *)local_1e8,&local_218);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_218);
  kj::Own<capnp::_::TestCapDestructor>::~Own(&local_228);
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  ::send(&local_2a0,(int)local_1e8,__buf,(size_t)pcVar6,(int)in_R8);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_> *)
             &local_268,&local_2a0);
  Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>::~Response(&local_268);
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::HoldResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::HoldResults> *)&local_2a0);
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  ::~Request((Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
              *)local_1e8);
  lVar1 = *(long *)((long)local_1a0 + -0x20);
  kj::Maybe<capnp::MessageSize>::Maybe((Maybe<capnp::MessageSize> *)local_368,(void *)0x0);
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_350,(Client *)(local_1a0 + lVar1),(Maybe<capnp::MessageSize> *)local_368);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send(&local_318,(int)&local_350,__buf_00,(size_t)pcVar6,(int)in_R8);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_2e0,&local_318);
  uVar4 = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::getN
                    (&local_2e0.super_Reader);
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
            (&local_2e0);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             &local_318);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::~Request(&local_350);
  kj::Maybe<capnp::MessageSize>::~Maybe((Maybe<capnp::MessageSize> *)local_368);
  if (uVar4 != 1) {
    local_369 = kj::_::Debug::shouldLog(ERROR);
    while (iVar8 = (int)in_R8, local_369 != false) {
      local_374[1] = 1;
      lVar1 = *(long *)((long)local_1a0 + -0x20);
      kj::Maybe<capnp::MessageSize>::Maybe((Maybe<capnp::MessageSize> *)local_440,(void *)0x0);
      capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
                (&local_428,(Client *)(local_1a0 + lVar1),(Maybe<capnp::MessageSize> *)local_440);
      Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
      ::send(&local_3f0,(int)&local_428,__buf_01,(size_t)pcVar6,iVar8);
      kj::
      Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
      ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
              *)&local_3b8,&local_3f0);
      local_374[0] = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::
                     getN(&local_3b8.super_Reader);
      pcVar6 = 
      "\"failed: expected \" \"(1) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 1, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
      ;
      in_R8 = 
      "failed: expected (1) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())"
      ;
      kj::_::Debug::log<char_const(&)[96],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x2e7,ERROR,
                 "\"failed: expected \" \"(1) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 1, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
                 ,(char (*) [96])
                  "failed: expected (1) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())"
                 ,(int *)(local_374 + 1),local_374);
      Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
                (&local_3b8);
      RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::
      ~RemotePromise((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                      *)&local_3f0);
      Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
      ::~Request(&local_428);
      kj::Maybe<capnp::MessageSize>::~Maybe((Maybe<capnp::MessageSize> *)local_440);
      local_369 = false;
    }
  }
  if ((destructionPromise.super_PromiseBase.node.ptr._3_1_ & 1) != 0) {
    local_441 = kj::_::Debug::shouldLog(ERROR);
    while (local_441 != false) {
      pcVar6 = "\"failed: expected \" \"!(destroyed)\"";
      in_R8 = "failed: expected !(destroyed)";
      kj::_::Debug::log<char_const(&)[30]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x2ea,ERROR,"\"failed: expected \" \"!(destroyed)\"",
                 (char (*) [30])"failed: expected !(destroyed)");
      local_441 = false;
    }
  }
  kj::Maybe<capnp::MessageSize>::Maybe((Maybe<capnp::MessageSize> *)local_520,(void *)0x0);
  capnproto_test::capnp::test::TestMoreStuff::Client::callHeldRequest
            (&local_508,(Client *)local_1a0,(Maybe<capnp::MessageSize> *)local_520);
  Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
  ::send(&local_4d0,(int)&local_508,__buf_02,(size_t)pcVar6,(int)in_R8);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>
              *)&local_498,&local_4d0);
  RVar9 = capnproto_test::capnp::test::TestMoreStuff::CallHeldResults::Reader::getS
                    (&local_498.super_Reader);
  local_458.content.size_ = RVar9.super_StringPtr.content.size_;
  pcVar6 = RVar9.super_StringPtr.content.ptr;
  local_458.content.ptr = pcVar6;
  bVar3 = kj::operator==("bar",&local_458);
  Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>::~Response(&local_498);
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults> *)
             &local_4d0);
  Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
  ::~Request(&local_508);
  kj::Maybe<capnp::MessageSize>::~Maybe((Maybe<capnp::MessageSize> *)local_520);
  if (!bVar3) {
    local_521 = kj::_::Debug::shouldLog(ERROR);
    while (iVar8 = (int)in_R8, local_521 != false) {
      kj::Maybe<capnp::MessageSize>::Maybe
                ((Maybe<capnp::MessageSize> *)&capCopy.field_0x10,(void *)0x0);
      capnproto_test::capnp::test::TestMoreStuff::Client::callHeldRequest
                (&local_5e8,(Client *)local_1a0,(Maybe<capnp::MessageSize> *)&capCopy.field_0x10);
      Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
      ::send(&local_5b0,(int)&local_5e8,__buf_03,(size_t)pcVar6,iVar8);
      kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>::
      wait((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_> *
           )&local_578,&local_5b0);
      AVar10 = (ArrayPtr<const_char>)
               capnproto_test::capnp::test::TestMoreStuff::CallHeldResults::Reader::getS
                         (&local_578.super_Reader);
      pcVar6 = 
      "\"failed: expected \" \"(\\\"bar\\\") == (client.callHeldRequest().send().wait(context.waitScope).getS())\", \"bar\", client.callHeldRequest().send().wait(context.waitScope).getS()"
      ;
      in_R8 = 
      "failed: expected (\"bar\") == (client.callHeldRequest().send().wait(context.waitScope).getS())"
      ;
      local_538 = AVar10;
      kj::_::Debug::log<char_const(&)[93],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x2ed,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (client.callHeldRequest().send().wait(context.waitScope).getS())\", \"bar\", client.callHeldRequest().send().wait(context.waitScope).getS()"
                 ,(char (*) [93])
                  "failed: expected (\"bar\") == (client.callHeldRequest().send().wait(context.waitScope).getS())"
                 ,(char (*) [4])0xa54964,(Reader *)&local_538);
      Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>::~Response(&local_578);
      RemotePromise<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>::~RemotePromise
                ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults> *)
                 &local_5b0);
      Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
      ::~Request(&local_5e8);
      kj::Maybe<capnp::MessageSize>::~Maybe((Maybe<capnp::MessageSize> *)&capCopy.field_0x10);
      local_521 = false;
    }
  }
  kj::Maybe<capnp::MessageSize>::Maybe((Maybe<capnp::MessageSize> *)local_6e0,(void *)0x0);
  capnproto_test::capnp::test::TestMoreStuff::Client::getHeldRequest
            (&local_6c8,(Client *)local_1a0,(Maybe<capnp::MessageSize> *)local_6e0);
  Request<capnproto_test::capnp::test::TestMoreStuff::GetHeldParams,_capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>
  ::send(&local_690,(int)&local_6c8,__buf_04,(size_t)pcVar6,(int)in_R8);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>_>
              *)&local_658,&local_690);
  capnproto_test::capnp::test::TestMoreStuff::GetHeldResults::Reader::getCap
            ((Client *)local_618,&local_658.super_Reader);
  Response<capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>::~Response(&local_658);
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::GetHeldResults> *)&local_690
            );
  Request<capnproto_test::capnp::test::TestMoreStuff::GetHeldParams,_capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>
  ::~Request(&local_6c8);
  kj::Maybe<capnp::MessageSize>::~Maybe((Maybe<capnp::MessageSize> *)local_6e0);
  request_1.hook.ptr._4_4_ =
       TestNetworkAdapter::getSentCount((TestNetworkAdapter *)context.restorer._8_8_);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_738,(void *)0x0);
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_720,(Client *)local_618,&local_738);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_738);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setI((Builder *)local_720,0x7b);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setJ((Builder *)local_720,true);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)local_7c0,(int)local_720,__buf_05,(size_t)pcVar6,(int)in_R8);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             &local_788,local_7c0);
  RVar9 = capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                    (&local_788.super_Reader);
  local_748.content.size_ = RVar9.super_StringPtr.content.size_;
  pcVar6 = RVar9.super_StringPtr.content.ptr;
  local_748.content.ptr = pcVar6;
  bVar3 = kj::operator==("foo",&local_748);
  Response<capnproto_test::capnp::test::TestInterface::FooResults>::~Response(&local_788);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)local_7c0);
  if (!bVar3) {
    local_7c1 = kj::_::Debug::shouldLog(ERROR);
    pvVar7 = extraout_RDX;
    while (local_7c1 != false) {
      Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
      ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_850,(int)local_720,pvVar7,(size_t)pcVar6,(int)in_R8);
      kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
                ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>
                  *)&local_818,local_850);
      AVar10 = (ArrayPtr<const_char>)
               capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                         (&local_818.super_Reader);
      pcVar6 = 
      "\"failed: expected \" \"(\\\"foo\\\") == (request.send().wait(context.waitScope).getX())\", \"foo\", request.send().wait(context.waitScope).getX()"
      ;
      in_R8 = "failed: expected (\"foo\") == (request.send().wait(context.waitScope).getX())";
      local_7d8 = AVar10;
      kj::_::Debug::log<char_const(&)[76],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x2f9,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (request.send().wait(context.waitScope).getX())\", \"foo\", request.send().wait(context.waitScope).getX()"
                 ,(char (*) [76])
                  "failed: expected (\"foo\") == (request.send().wait(context.waitScope).getX())",
                 (char (*) [4])0xa4c8db,(Reader *)&local_7d8);
      Response<capnproto_test::capnp::test::TestInterface::FooResults>::~Response(&local_818);
      RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
                ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)local_850)
      ;
      pvVar7 = extraout_RDX_00;
      local_7c1 = false;
    }
  }
  uVar2 = request_1.hook.ptr._4_4_;
  uVar5 = TestNetworkAdapter::getSentCount((TestNetworkAdapter *)context.restorer._8_8_);
  pcVar6 = (char *)(ulong)uVar5;
  if (uVar2 != uVar5) {
    request_2.hook.ptr._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)request_2.hook.ptr._7_1_ != false) {
      request_2.hook.ptr._0_4_ =
           TestNetworkAdapter::getSentCount((TestNetworkAdapter *)context.restorer._8_8_);
      pcVar6 = 
      "\"failed: expected \" \"(oldSentCount) == (context.clientNetwork.getSentCount())\", oldSentCount, context.clientNetwork.getSentCount()"
      ;
      in_R8 = "failed: expected (oldSentCount) == (context.clientNetwork.getSentCount())";
      kj::_::Debug::log<char_const(&)[74],unsigned_int&,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x2fa,ERROR,
                 "\"failed: expected \" \"(oldSentCount) == (context.clientNetwork.getSentCount())\", oldSentCount, context.clientNetwork.getSentCount()"
                 ,(char (*) [74])
                  "failed: expected (oldSentCount) == (context.clientNetwork.getSentCount())",
                 (uint *)((long)&request_1.hook.ptr + 4),(uint *)&request_2.hook.ptr);
      request_2.hook.ptr._7_1_ = false;
    }
  }
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::~Request((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_720);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_8a8,(void *)0x0);
  capnproto_test::capnp::test::TestMoreStuff::Client::callFooRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
              *)local_890,(Client *)local_1a0,&local_8a8);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_8a8);
  capnproto_test::capnp::test::TestMoreStuff::CallFooParams::Builder::setCap
            ((Builder *)local_890,(Client *)local_618);
  Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
          *)local_930,(int)local_890,__buf_06,(size_t)pcVar6,(int)in_R8);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_>
              *)&local_8f8,local_930);
  RVar9 = capnproto_test::capnp::test::TestMoreStuff::CallFooResults::Reader::getS
                    (&local_8f8.super_Reader);
  local_8b8.content.size_ = RVar9.super_StringPtr.content.size_;
  pcVar6 = RVar9.super_StringPtr.content.ptr;
  local_8b8.content.ptr = pcVar6;
  bVar3 = kj::operator==("bar",&local_8b8);
  Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>::~Response(&local_8f8);
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::CallFooResults> *)local_930)
  ;
  if (!bVar3) {
    local_931 = kj::_::Debug::shouldLog(ERROR);
    pvVar7 = extraout_RDX_01;
    while (local_931 != false) {
      Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
      ::send(&local_9c0,(int)local_890,pvVar7,(size_t)pcVar6,(int)in_R8);
      kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_>::
      wait((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>_> *)
           &local_988,&local_9c0);
      AVar10 = (ArrayPtr<const_char>)
               capnproto_test::capnp::test::TestMoreStuff::CallFooResults::Reader::getS
                         (&local_988.super_Reader);
      pcVar6 = 
      "\"failed: expected \" \"(\\\"bar\\\") == (request.send().wait(context.waitScope).getS())\", \"bar\", request.send().wait(context.waitScope).getS()"
      ;
      in_R8 = "failed: expected (\"bar\") == (request.send().wait(context.waitScope).getS())";
      local_948 = AVar10;
      kj::_::Debug::log<char_const(&)[76],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x301,ERROR,
                 "\"failed: expected \" \"(\\\"bar\\\") == (request.send().wait(context.waitScope).getS())\", \"bar\", request.send().wait(context.waitScope).getS()"
                 ,(char (*) [76])
                  "failed: expected (\"bar\") == (request.send().wait(context.waitScope).getS())",
                 (char (*) [4])0xa54964,(Reader *)&local_948);
      Response<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>::~Response(&local_988);
      RemotePromise<capnproto_test::capnp::test::TestMoreStuff::CallFooResults>::~RemotePromise
                ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::CallFooResults> *)
                 &local_9c0);
      pvVar7 = extraout_RDX_02;
      local_931 = false;
    }
  }
  Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
  ::~Request((Request<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
              *)local_890);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)local_618);
  lVar1 = *(long *)((long)local_1a0 + -0x20);
  kj::Maybe<capnp::MessageSize>::Maybe((Maybe<capnp::MessageSize> *)local_a88,(void *)0x0);
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_a70,(Client *)(local_1a0 + lVar1),(Maybe<capnp::MessageSize> *)local_a88);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send(&local_a38,(int)&local_a70,__buf_07,(size_t)pcVar6,(int)in_R8);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_a00,&local_a38);
  uVar4 = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::getN
                    (&local_a00.super_Reader);
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
            (&local_a00);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             &local_a38);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::~Request(&local_a70);
  kj::Maybe<capnp::MessageSize>::~Maybe((Maybe<capnp::MessageSize> *)local_a88);
  if (uVar4 != 5) {
    local_a89 = kj::_::Debug::shouldLog(ERROR);
    while (iVar8 = (int)in_R8, local_a89 != false) {
      local_a94[1] = 5;
      lVar1 = *(long *)((long)local_1a0 + -0x20);
      kj::Maybe<capnp::MessageSize>::Maybe(&local_b60,(void *)0x0);
      capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
                (&local_b48,(Client *)(local_1a0 + lVar1),&local_b60);
      Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
      ::send(&local_b10,(int)&local_b48,__buf_08,(size_t)pcVar6,iVar8);
      kj::
      Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
      ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
              *)&local_ad8,&local_b10);
      local_a94[0] = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::
                     getN(&local_ad8.super_Reader);
      pcVar6 = 
      "\"failed: expected \" \"(5) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 5, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
      ;
      in_R8 = 
      "failed: expected (5) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())"
      ;
      kj::_::Debug::log<char_const(&)[96],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x306,ERROR,
                 "\"failed: expected \" \"(5) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 5, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
                 ,(char (*) [96])
                  "failed: expected (5) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())"
                 ,(int *)(local_a94 + 1),local_a94);
      Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
                (&local_ad8);
      RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::
      ~RemotePromise((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                      *)&local_b10);
      Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
      ::~Request(&local_b48);
      kj::Maybe<capnp::MessageSize>::~Maybe(&local_b60);
      local_a89 = false;
    }
  }
  lVar1 = *(long *)((long)local_1a0 + -0x20);
  kj::Maybe<capnp::MessageSize>::Maybe((Maybe<capnp::MessageSize> *)local_c28,(void *)0x0);
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_c10,(Client *)(local_1a0 + lVar1),(Maybe<capnp::MessageSize> *)local_c28);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send(&local_bd8,(int)&local_c10,__buf_09,(size_t)pcVar6,(int)in_R8);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_ba0,&local_bd8);
  uVar4 = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::getN
                    (&local_ba0.super_Reader);
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
            (&local_ba0);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             &local_bd8);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::~Request(&local_c10);
  kj::Maybe<capnp::MessageSize>::~Maybe((Maybe<capnp::MessageSize> *)local_c28);
  if (uVar4 != 6) {
    local_c29 = kj::_::Debug::shouldLog(ERROR);
    while (iVar8 = (int)in_R8, local_c29 != false) {
      local_c34[1] = 6;
      lVar1 = *(long *)((long)local_1a0 + -0x20);
      kj::Maybe<capnp::MessageSize>::Maybe(&local_d00,(void *)0x0);
      capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
                (&local_ce8,(Client *)(local_1a0 + lVar1),&local_d00);
      Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
      ::send(&local_cb0,(int)&local_ce8,__buf_10,(size_t)pcVar6,iVar8);
      kj::
      Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
      ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
              *)&local_c78,&local_cb0);
      local_c34[0] = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::
                     getN(&local_c78.super_Reader);
      pcVar6 = 
      "\"failed: expected \" \"(6) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 6, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
      ;
      in_R8 = 
      "failed: expected (6) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())"
      ;
      kj::_::Debug::log<char_const(&)[96],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x307,ERROR,
                 "\"failed: expected \" \"(6) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 6, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
                 ,(char (*) [96])
                  "failed: expected (6) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())"
                 ,(int *)(local_c34 + 1),local_c34);
      Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
                (&local_c78);
      RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::
      ~RemotePromise((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                      *)&local_cb0);
      Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
      ::~Request(&local_ce8);
      kj::Maybe<capnp::MessageSize>::~Maybe(&local_d00);
      local_c29 = false;
    }
  }
  lVar1 = *(long *)((long)local_1a0 + -0x20);
  kj::Maybe<capnp::MessageSize>::Maybe((Maybe<capnp::MessageSize> *)local_dc8,(void *)0x0);
  capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
            (&local_db0,(Client *)(local_1a0 + lVar1),(Maybe<capnp::MessageSize> *)local_dc8);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::send(&local_d78,(int)&local_db0,__buf_11,(size_t)pcVar6,(int)in_R8);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
  ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
          *)&local_d40,&local_d78);
  uVar4 = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::getN
                    (&local_d40.super_Reader);
  Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
            (&local_d40);
  RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults> *)
             &local_d78);
  Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
  ::~Request(&local_db0);
  kj::Maybe<capnp::MessageSize>::~Maybe((Maybe<capnp::MessageSize> *)local_dc8);
  if (uVar4 != 7) {
    local_dc9 = kj::_::Debug::shouldLog(ERROR);
    while (iVar8 = (int)in_R8, local_dc9 != false) {
      local_dd4[1] = 7;
      lVar1 = *(long *)((long)local_1a0 + -0x20);
      kj::Maybe<capnp::MessageSize>::Maybe((Maybe<capnp::MessageSize> *)local_ea0,(void *)0x0);
      capnproto_test::capnp::test::TestCallOrder::Client::getCallSequenceRequest
                (&local_e88,(Client *)(local_1a0 + lVar1),(Maybe<capnp::MessageSize> *)local_ea0);
      Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
      ::send(&local_e50,(int)&local_e88,__buf_12,(size_t)pcVar6,iVar8);
      kj::
      Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
      ::wait((Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
              *)&local_e18,&local_e50);
      local_dd4[0] = capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults::Reader::
                     getN(&local_e18.super_Reader);
      pcVar6 = 
      "\"failed: expected \" \"(7) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 7, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
      ;
      in_R8 = 
      "failed: expected (7) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())"
      ;
      kj::_::Debug::log<char_const(&)[96],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x308,ERROR,
                 "\"failed: expected \" \"(7) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())\", 7, client.getCallSequenceRequest().send().wait(context.waitScope).getN()"
                 ,(char (*) [96])
                  "failed: expected (7) == (client.getCallSequenceRequest().send().wait(context.waitScope).getN())"
                 ,(int *)(local_dd4 + 1),local_dd4);
      Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::~Response
                (&local_e18);
      RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>::
      ~RemotePromise((RemotePromise<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
                      *)&local_e50);
      Request<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceParams,_capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>
      ::~Request(&local_e88);
      kj::Maybe<capnp::MessageSize>::~Maybe((Maybe<capnp::MessageSize> *)local_ea0);
      local_dc9 = false;
    }
  }
  if ((destructionPromise.super_PromiseBase.node.ptr._3_1_ & 1) != 0) {
    local_ea1 = kj::_::Debug::shouldLog(ERROR);
    while (local_ea1 != false) {
      kj::_::Debug::log<char_const(&)[30]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x30b,ERROR,"\"failed: expected \" \"!(destroyed)\"",
                 (char (*) [30])"failed: expected !(destroyed)");
      local_ea1 = false;
    }
  }
  capnproto_test::capnp::test::TestMoreStuff::Client::~Client((Client *)local_1a0);
  kj::Promise<void>::wait((Promise<void> *)local_168,&context.loop.daemons.ptr);
  if ((destructionPromise.super_PromiseBase.node.ptr._3_1_ & 1) == 0) {
    local_ea2 = kj::_::Debug::shouldLog(ERROR);
    while (local_ea2 != false) {
      kj::_::Debug::log<char_const(&)[27]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x311,ERROR,"\"failed: expected \" \"destroyed\"",
                 (char (*) [27])"failed: expected destroyed");
      local_ea2 = false;
    }
  }
  kj::Promise<void>::~Promise((Promise<void> *)local_168);
  kj::PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_148);
  TestContext::~TestContext((TestContext *)&paf.fulfiller.ptr);
  return;
}

Assistant:

TEST(Rpc, RetainAndRelease) {
  TestContext context;

  auto paf = kj::newPromiseAndFulfiller<void>();
  bool destroyed = false;
  auto destructionPromise = paf.promise.then([&]() { destroyed = true; }).eagerlyEvaluate(nullptr);

  {
    auto client = context.connect(test::TestSturdyRefObjectId::Tag::TEST_MORE_STUFF)
        .castAs<test::TestMoreStuff>();

    {
      auto request = client.holdRequest();
      request.setCap(kj::heap<TestCapDestructor>(kj::mv(paf.fulfiller)));
      request.send().wait(context.waitScope);
    }

    // Do some other call to add a round trip.
    EXPECT_EQ(1, client.getCallSequenceRequest().send().wait(context.waitScope).getN());

    // Shouldn't be destroyed because it's being held by the server.
    EXPECT_FALSE(destroyed);

    // We can ask it to call the held capability.
    EXPECT_EQ("bar", client.callHeldRequest().send().wait(context.waitScope).getS());

    {
      // We can get the cap back from it.
      auto capCopy = client.getHeldRequest().send().wait(context.waitScope).getCap();

      {
        // And call it, without any network communications.
        uint oldSentCount = context.clientNetwork.getSentCount();
        auto request = capCopy.fooRequest();
        request.setI(123);
        request.setJ(true);
        EXPECT_EQ("foo", request.send().wait(context.waitScope).getX());
        EXPECT_EQ(oldSentCount, context.clientNetwork.getSentCount());
      }

      {
        // We can send another copy of the same cap to another method, and it works.
        auto request = client.callFooRequest();
        request.setCap(capCopy);
        EXPECT_EQ("bar", request.send().wait(context.waitScope).getS());
      }
    }

    // Give some time to settle.
    EXPECT_EQ(5, client.getCallSequenceRequest().send().wait(context.waitScope).getN());
    EXPECT_EQ(6, client.getCallSequenceRequest().send().wait(context.waitScope).getN());
    EXPECT_EQ(7, client.getCallSequenceRequest().send().wait(context.waitScope).getN());

    // Can't be destroyed, we haven't released it.
    EXPECT_FALSE(destroyed);
  }

  // We released our client, which should cause the server to be released, which in turn will
  // release the cap pointing back to us.
  destructionPromise.wait(context.waitScope);
  EXPECT_TRUE(destroyed);
}